

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O0

void Abc_TruthRpoPerform(Rpo_TtStore_t *p,int nThreshold,int fVerbose)

{
  clock_t cVar1;
  Literal_t *lit_00;
  clock_t cVar2;
  float percent;
  Literal_t *lit;
  int rpoCount;
  int i;
  clock_t clk;
  int fVerbose_local;
  int nThreshold_local;
  Rpo_TtStore_t *p_local;
  
  cVar1 = clock();
  lit._0_4_ = 0;
  for (lit._4_4_ = 0; lit._4_4_ < p->nFuncs; lit._4_4_ = lit._4_4_ + 1) {
    if (fVerbose != 0) {
      Abc_Print(-2,"%d: ",(ulong)(lit._4_4_ + 1));
    }
    lit_00 = Rpo_Factorize((uint *)p->pFuncs[lit._4_4_],p->nVars,nThreshold,fVerbose);
    if (lit_00 == (Literal_t *)0x0) {
      if (fVerbose != 0) {
        Abc_Print(-2,"null\n");
        Abc_Print(-2,"\n\n");
      }
    }
    else {
      if (fVerbose != 0) {
        Abc_Print(-2,"Solution : %s\n",lit_00->expression->pArray);
        Abc_Print(-2,"\n\n");
      }
      Lit_Free(lit_00);
      lit._0_4_ = (uint)lit + 1;
    }
  }
  Abc_Print(-2,"%d of %d (%.2f %%) functions are RPO.\n",
            (double)(((float)(int)(uint)lit * 100.0) / (float)p->nFuncs),(ulong)(uint)lit,
            (ulong)(uint)p->nFuncs);
  cVar2 = clock();
  Abc_PrintTime(1,"Time",cVar2 - cVar1);
  return;
}

Assistant:

void Abc_TruthRpoPerform(Rpo_TtStore_t * p, int nThreshold, int fVerbose) {
    clock_t clk = clock();
    int i;
    int rpoCount = 0;
    Literal_t* lit;
    float percent;
    for (i = 0; i < p->nFuncs; i++) {
//        if(i>1000) {
//            continue;
//        }
////        
//        if(i!= 2196 ) { //5886
//            continue;
//        }
        if(fVerbose) {
            Abc_Print(-2,"%d: ", i+1);
        }
            
        lit = Rpo_Factorize((unsigned *) p->pFuncs[i], p->nVars, nThreshold, fVerbose);
        if (lit != NULL) {
            if(fVerbose) {
                Abc_Print(-2, "Solution : %s\n", lit->expression->pArray);
                Abc_Print(-2, "\n\n");
            }
            Lit_Free(lit);
            rpoCount++;
        } else {
            if(fVerbose) {
                Abc_Print(-2, "null\n");
                Abc_Print(-2, "\n\n");
            }
        }
    }
    percent = (rpoCount * 100.0) / p->nFuncs;
    Abc_Print(-2,"%d of %d (%.2f %%) functions are RPO.\n", rpoCount,p->nFuncs,percent);
    Abc_PrintTime(1, "Time", clock() - clk);
}